

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O3

int ConnectSeanet(SEANET *pSeanet,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char line [256];
  uchar databuf [22];
  byte local_1e8;
  char local_1e7;
  int *local_e8;
  BOOL *local_e0;
  int *local_d8;
  int *local_d0;
  int *local_c8;
  int *local_c0;
  int *local_b8;
  int *local_b0;
  double *local_a8;
  int *local_a0;
  int *local_98;
  int *local_90;
  int *local_88;
  int *local_80;
  int *local_78;
  double *local_70;
  double *local_68;
  int *local_60;
  int *local_58;
  int local_4c;
  uchar local_48 [20];
  byte bStack_34;
  undefined1 uStack_33;
  
  memset(pSeanet->szCfgFilePath,0,0x100);
  sprintf(pSeanet->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_1e8,0,0x100);
    memset(pSeanet->szDevPath + 5,0,0xfb);
    builtin_strncpy(pSeanet->szDevPath,"COM1",5);
    pSeanet->BaudRate = 0x1c200;
    pSeanet->timeout = 0x5dc;
    pSeanet->threadperiod = 100;
    pSeanet->bSaveRawData = 1;
    pSeanet->RangeScale = 0x1e;
    pSeanet->Gain = 0x32;
    pSeanet->Sensitivity = 3;
    pSeanet->Contrast = 0x19;
    pSeanet->ScanDirection = 0;
    pSeanet->ScanWidth = 0x168;
    pSeanet->StepAngleSize = 3.6;
    pSeanet->NBins = 200;
    pSeanet->adc8on = 1;
    pSeanet->scanright = 0;
    pSeanet->invert = 0;
    pSeanet->stareLLim = 0;
    pSeanet->VelocityOfSound = 0x5dc;
    pSeanet->alpha_max_err = 0.01;
    pSeanet->d_max_err = 0.1;
    pSeanet->HorizontalBeam = 3;
    pSeanet->VerticalBeam = 0x28;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      local_e8 = &pSeanet->threadperiod;
      local_e0 = &pSeanet->bSaveRawData;
      local_d8 = &pSeanet->RangeScale;
      local_d0 = &pSeanet->Gain;
      local_c8 = &pSeanet->Sensitivity;
      local_c0 = &pSeanet->Contrast;
      local_b8 = &pSeanet->ScanDirection;
      local_b0 = &pSeanet->ScanWidth;
      local_a8 = &pSeanet->StepAngleSize;
      local_a0 = &pSeanet->NBins;
      local_98 = &pSeanet->adc8on;
      local_90 = &pSeanet->scanright;
      local_88 = &pSeanet->invert;
      local_80 = &pSeanet->stareLLim;
      local_78 = &pSeanet->VelocityOfSound;
      local_70 = &pSeanet->alpha_max_err;
      local_68 = &pSeanet->d_max_err;
      local_60 = &pSeanet->HorizontalBeam;
      local_58 = &pSeanet->VerticalBeam;
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a0531;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a0549;
        }
        if (local_1e8 != 0x23) break;
LAB_001a0531:
        if (pcVar2 == (char *)0x0) goto LAB_001a054e;
      }
      if (local_1e8 == 0x24) goto LAB_001a054e;
LAB_001a0549:
      if (pcVar2 == (char *)0x0) {
LAB_001a054e:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%255s",pSeanet->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a05bd;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a05c9;
        }
        if (local_1e8 != 0x23) break;
LAB_001a05bd:
        if (pcVar2 == (char *)0x0) goto LAB_001a05ce;
      }
      if (local_1e8 == 0x24) goto LAB_001a05ce;
LAB_001a05c9:
      if (pcVar2 == (char *)0x0) {
LAB_001a05ce:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",&pSeanet->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a063d;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a0649;
        }
        if (local_1e8 != 0x23) break;
LAB_001a063d:
        if (pcVar2 == (char *)0x0) goto LAB_001a064e;
      }
      if (local_1e8 == 0x24) goto LAB_001a064e;
LAB_001a0649:
      if (pcVar2 == (char *)0x0) {
LAB_001a064e:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",&pSeanet->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a06bd;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a06c9;
        }
        if (local_1e8 != 0x23) break;
LAB_001a06bd:
        if (pcVar2 == (char *)0x0) goto LAB_001a06ce;
      }
      if (local_1e8 == 0x24) goto LAB_001a06ce;
LAB_001a06c9:
      if (pcVar2 == (char *)0x0) {
LAB_001a06ce:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_e8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a0742;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a074e;
        }
        if (local_1e8 != 0x23) break;
LAB_001a0742:
        if (pcVar2 == (char *)0x0) goto LAB_001a0753;
      }
      if (local_1e8 == 0x24) goto LAB_001a0753;
LAB_001a074e:
      if (pcVar2 == (char *)0x0) {
LAB_001a0753:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_e0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a07c7;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a07d3;
        }
        if (local_1e8 != 0x23) break;
LAB_001a07c7:
        if (pcVar2 == (char *)0x0) goto LAB_001a07d8;
      }
      if (local_1e8 == 0x24) goto LAB_001a07d8;
LAB_001a07d3:
      if (pcVar2 == (char *)0x0) {
LAB_001a07d8:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_d8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a084c;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a0858;
        }
        if (local_1e8 != 0x23) break;
LAB_001a084c:
        if (pcVar2 == (char *)0x0) goto LAB_001a085d;
      }
      if (local_1e8 == 0x24) goto LAB_001a085d;
LAB_001a0858:
      if (pcVar2 == (char *)0x0) {
LAB_001a085d:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_d0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a08d1;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a08dd;
        }
        if (local_1e8 != 0x23) break;
LAB_001a08d1:
        if (pcVar2 == (char *)0x0) goto LAB_001a08e2;
      }
      if (local_1e8 == 0x24) goto LAB_001a08e2;
LAB_001a08dd:
      if (pcVar2 == (char *)0x0) {
LAB_001a08e2:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_c8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a0956;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a0962;
        }
        if (local_1e8 != 0x23) break;
LAB_001a0956:
        if (pcVar2 == (char *)0x0) goto LAB_001a0967;
      }
      if (local_1e8 == 0x24) goto LAB_001a0967;
LAB_001a0962:
      if (pcVar2 == (char *)0x0) {
LAB_001a0967:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_c0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a09db;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a09e7;
        }
        if (local_1e8 != 0x23) break;
LAB_001a09db:
        if (pcVar2 == (char *)0x0) goto LAB_001a09ec;
      }
      if (local_1e8 == 0x24) goto LAB_001a09ec;
LAB_001a09e7:
      if (pcVar2 == (char *)0x0) {
LAB_001a09ec:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_b8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a0a60;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a0a6c;
        }
        if (local_1e8 != 0x23) break;
LAB_001a0a60:
        if (pcVar2 == (char *)0x0) goto LAB_001a0a71;
      }
      if (local_1e8 == 0x24) goto LAB_001a0a71;
LAB_001a0a6c:
      if (pcVar2 == (char *)0x0) {
LAB_001a0a71:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_b0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a0ae5;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a0af1;
        }
        if (local_1e8 != 0x23) break;
LAB_001a0ae5:
        if (pcVar2 == (char *)0x0) goto LAB_001a0af6;
      }
      if (local_1e8 == 0x24) goto LAB_001a0af6;
LAB_001a0af1:
      if (pcVar2 == (char *)0x0) {
LAB_001a0af6:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%lf",local_a8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a0b6a;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a0b76;
        }
        if (local_1e8 != 0x23) break;
LAB_001a0b6a:
        if (pcVar2 == (char *)0x0) goto LAB_001a0b7b;
      }
      if (local_1e8 == 0x24) goto LAB_001a0b7b;
LAB_001a0b76:
      if (pcVar2 == (char *)0x0) {
LAB_001a0b7b:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_a0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a0bef;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a0bfb;
        }
        if (local_1e8 != 0x23) break;
LAB_001a0bef:
        if (pcVar2 == (char *)0x0) goto LAB_001a0c00;
      }
      if (local_1e8 == 0x24) goto LAB_001a0c00;
LAB_001a0bfb:
      if (pcVar2 == (char *)0x0) {
LAB_001a0c00:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_98);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a0c74;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a0c80;
        }
        if (local_1e8 != 0x23) break;
LAB_001a0c74:
        if (pcVar2 == (char *)0x0) goto LAB_001a0c85;
      }
      if (local_1e8 == 0x24) goto LAB_001a0c85;
LAB_001a0c80:
      if (pcVar2 == (char *)0x0) {
LAB_001a0c85:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_90);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a0cf9;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a0d05;
        }
        if (local_1e8 != 0x23) break;
LAB_001a0cf9:
        if (pcVar2 == (char *)0x0) goto LAB_001a0d0a;
      }
      if (local_1e8 == 0x24) goto LAB_001a0d0a;
LAB_001a0d05:
      if (pcVar2 == (char *)0x0) {
LAB_001a0d0a:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_88);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a0d7e;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a0d8a;
        }
        if (local_1e8 != 0x23) break;
LAB_001a0d7e:
        if (pcVar2 == (char *)0x0) goto LAB_001a0d8f;
      }
      if (local_1e8 == 0x24) goto LAB_001a0d8f;
LAB_001a0d8a:
      if (pcVar2 == (char *)0x0) {
LAB_001a0d8f:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_80);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a0e03;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a0e0f;
        }
        if (local_1e8 != 0x23) break;
LAB_001a0e03:
        if (pcVar2 == (char *)0x0) goto LAB_001a0e14;
      }
      if (local_1e8 == 0x24) goto LAB_001a0e14;
LAB_001a0e0f:
      if (pcVar2 == (char *)0x0) {
LAB_001a0e14:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_78);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a0e88;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a0e94;
        }
        if (local_1e8 != 0x23) break;
LAB_001a0e88:
        if (pcVar2 == (char *)0x0) goto LAB_001a0e99;
      }
      if (local_1e8 == 0x24) goto LAB_001a0e99;
LAB_001a0e94:
      if (pcVar2 == (char *)0x0) {
LAB_001a0e99:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%lf",local_70);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a0f0d;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a0f19;
        }
        if (local_1e8 != 0x23) break;
LAB_001a0f0d:
        if (pcVar2 == (char *)0x0) goto LAB_001a0f1e;
      }
      if (local_1e8 == 0x24) goto LAB_001a0f1e;
LAB_001a0f19:
      if (pcVar2 == (char *)0x0) {
LAB_001a0f1e:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%lf",local_68);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a0f92;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a0f9e;
        }
        if (local_1e8 != 0x23) break;
LAB_001a0f92:
        if (pcVar2 == (char *)0x0) goto LAB_001a0fa3;
      }
      if (local_1e8 == 0x24) goto LAB_001a0fa3;
LAB_001a0f9e:
      if (pcVar2 == (char *)0x0) {
LAB_001a0fa3:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_60);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1e8,0x100,__stream), 0x24 < local_1e8) {
          if (local_1e8 == 0x25) goto LAB_001a1017;
          if (((local_1e8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1e7 != '/'))
          goto LAB_001a1023;
        }
        if (local_1e8 != 0x23) break;
LAB_001a1017:
        if (pcVar2 == (char *)0x0) goto LAB_001a1028;
      }
      if (local_1e8 == 0x24) goto LAB_001a1028;
LAB_001a1023:
      if (pcVar2 == (char *)0x0) {
LAB_001a1028:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_58);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_001a1078;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_001a1078:
  if (pSeanet->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pSeanet->threadperiod = 100;
  }
  if (0x167 < (uint)pSeanet->ScanDirection) {
    puts("Invalid parameter : ScanDirection.");
    pSeanet->ScanDirection = 0;
  }
  if (pSeanet->ScanWidth - 0x169U < 0xfffffe99) {
    puts("Invalid parameter : ScanWidth.");
    pSeanet->ScanWidth = 0x168;
  }
  if (pSeanet->VelocityOfSound < 1) {
    puts("Invalid parameter : VelocityOfSound.");
    pSeanet->VelocityOfSound = 0x5dc;
  }
  if (pSeanet->HorizontalBeam - 0x169U < 0xfffffe98) {
    puts("Invalid parameter : HorizontalBeam.");
    pSeanet->HorizontalBeam = 3;
  }
  if (pSeanet->VerticalBeam - 0x169U < 0xfffffe98) {
    puts("Invalid parameter : VerticalBeam.");
    pSeanet->VerticalBeam = 0x28;
  }
  iVar1 = OpenRS232Port(&pSeanet->RS232Port,pSeanet->szDevPath);
  if (iVar1 != 0) {
    puts("Unable to connect to a Seanet.");
    return 1;
  }
  iVar1 = (pSeanet->RS232Port).DevType;
  if (3 < iVar1 - 1U) {
    if ((iVar1 != 0) ||
       (iVar1 = SetOptionsComputerRS232Port
                          ((pSeanet->RS232Port).hDev,pSeanet->BaudRate,'\0',0,'\b','\0',
                           pSeanet->timeout), iVar1 != 0)) goto LAB_001a123f;
    tcflush(*(int *)&(pSeanet->RS232Port).hDev,2);
  }
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  bStack_34 = 0;
  uStack_33 = 0;
  local_4c = 0;
  iVar1 = GetLatestMsgSeanet(pSeanet,4,local_48,0x16,&local_4c);
  if (iVar1 == 0) {
    pSeanet->HeadInf = (uint)bStack_34;
    iVar1 = RebootSeanet(pSeanet);
    if (((iVar1 == 0) && (iVar1 = GetVersionSeanet(pSeanet), iVar1 == 0)) &&
       ((iVar1 = GetBBUserSeanet(pSeanet), iVar1 == 0 &&
        (iVar1 = SetHeadCommandSeanet(pSeanet), iVar1 == 0)))) {
      puts("Seanet connected.");
      return 0;
    }
  }
  else {
    puts("A Seanet is not responding correctly. ");
  }
LAB_001a123f:
  puts("Unable to connect to a Seanet.");
  CloseRS232Port(&pSeanet->RS232Port);
  return 1;
}

Assistant:

inline int ConnectSeanet(SEANET* pSeanet, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pSeanet->szCfgFilePath, 0, sizeof(pSeanet->szCfgFilePath));
	sprintf(pSeanet->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pSeanet->szDevPath, 0, sizeof(pSeanet->szDevPath));
		sprintf(pSeanet->szDevPath, "COM1");
		pSeanet->BaudRate = 115200;
		pSeanet->timeout = 1500;
		pSeanet->threadperiod = 100;
		pSeanet->bSaveRawData = 1;
		pSeanet->RangeScale = 30;
		pSeanet->Gain = 50;
		pSeanet->Sensitivity = 3;
		pSeanet->Contrast = 25;
		pSeanet->ScanDirection = 0;
		pSeanet->ScanWidth = 360;
		pSeanet->StepAngleSize = 3.6;
		pSeanet->NBins = 200;
		pSeanet->adc8on = 1;
		pSeanet->scanright = 0;
		pSeanet->invert = 0;
		pSeanet->stareLLim = 0;
		pSeanet->VelocityOfSound = 1500;
		pSeanet->alpha_max_err = 0.01;
		pSeanet->d_max_err = 0.1;
		pSeanet->HorizontalBeam = 3;
		pSeanet->VerticalBeam = 40;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pSeanet->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->RangeScale) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->Gain) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->Sensitivity) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->Contrast) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->ScanDirection) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->ScanWidth) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSeanet->StepAngleSize) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->NBins) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->adc8on) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->scanright) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->invert) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->stareLLim) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->VelocityOfSound) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSeanet->alpha_max_err) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSeanet->d_max_err) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->HorizontalBeam) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->VerticalBeam) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pSeanet->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pSeanet->threadperiod = 100;
	}
	if ((pSeanet->ScanDirection < 0)||(pSeanet->ScanDirection > 359))
	{
		printf("Invalid parameter : ScanDirection.\n");
		pSeanet->ScanDirection = 0;
	}
	if ((pSeanet->ScanWidth < 2)||(pSeanet->ScanWidth > 360))
	{
		printf("Invalid parameter : ScanWidth.\n");
		pSeanet->ScanWidth = 360;
	}
	if (pSeanet->VelocityOfSound <= 0)
	{
		printf("Invalid parameter : VelocityOfSound.\n");
		pSeanet->VelocityOfSound = 1500;
	}
	if ((pSeanet->HorizontalBeam <= 0)||(pSeanet->HorizontalBeam > 360))
	{
		printf("Invalid parameter : HorizontalBeam.\n");
		pSeanet->HorizontalBeam = 3;
	}
	if ((pSeanet->VerticalBeam <= 0)||(pSeanet->VerticalBeam > 360))
	{
		printf("Invalid parameter : VerticalBeam.\n");
		pSeanet->VerticalBeam = 40;
	}

	// Used to save raw data, should be handled specifically...
	//pSeanet->pfSaveFile = NULL;

	if (OpenRS232Port(&pSeanet->RS232Port, pSeanet->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pSeanet->RS232Port, pSeanet->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pSeanet->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	if (GetLatestAliveMsgSeanet(pSeanet) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	if (RebootSeanet(pSeanet) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	if (GetVersionSeanet(pSeanet) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	if (GetBBUserSeanet(pSeanet) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	if (SetHeadCommandSeanet(pSeanet) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	printf("Seanet connected.\n");

	return EXIT_SUCCESS;
}